

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_ge(void)

{
  int i;
  undefined4 local_4;
  
  for (local_4 = 0; local_4 < COUNT * 0x20; local_4 = local_4 + 1) {
    test_ge();
  }
  test_add_neg_y_diff_x();
  test_intialized_inf();
  test_ge_bytes();
  return;
}

Assistant:

static void run_ge(void) {
    int i;
    for (i = 0; i < COUNT * 32; i++) {
        test_ge();
    }
    test_add_neg_y_diff_x();
    test_intialized_inf();
    test_ge_bytes();
}